

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdSignPsbt(void *handle,void *psbt_handle,char *privkey,bool has_grind_r)

{
  pointer pcVar1;
  pointer puVar2;
  bool bVar3;
  CfdException *pCVar4;
  string privkey_str;
  undefined1 local_98 [32];
  Privkey local_78;
  Privkey local_58;
  
  cfd::Initialize();
  pcVar1 = local_98 + 0x10;
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_98);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_);
  }
  bVar3 = cfd::capi::IsEmptyString(privkey);
  if (!bVar3) {
    if (*(long *)((long)psbt_handle + 0x18) != 0) {
      std::__cxx11::string::string((string *)local_98,privkey,(allocator *)&local_58);
      cfd::core::Privkey::Privkey(&local_58);
      bVar3 = cfd::core::Privkey::HasWif((string *)local_98,(NetType *)0x0,(bool *)0x0);
      if (bVar3) {
        cfd::core::Privkey::FromWif(&local_78,(string *)local_98,kCustomChain,true);
      }
      else {
        cfd::core::Privkey::Privkey(&local_78,(string *)local_98,kMainnet,true);
      }
      puVar2 = local_58.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 == (pointer)0x0) {
        local_58.is_compressed_ = local_78.is_compressed_;
        local_58._25_3_ = local_78._25_3_;
        local_58.net_type_ = local_78.net_type_;
      }
      else {
        operator_delete(puVar2);
        local_58.is_compressed_ = local_78.is_compressed_;
        local_58._25_3_ = local_78._25_3_;
        local_58.net_type_ = local_78.net_type_;
        if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      cfd::core::Psbt::Sign(*(Psbt **)((long)psbt_handle + 0x18),&local_58,has_grind_r);
      if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      return 0;
    }
    local_98._0_8_ = "cfdcapi_psbt.cpp";
    local_98._8_4_ = 0x1cb;
    local_98._16_8_ = "CfdSignPsbt";
    cfd::core::logger::log<>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_98._0_8_ = "cfdcapi_psbt.cpp";
  local_98._8_4_ = 0x1c5;
  local_98._16_8_ = "CfdSignPsbt";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"privkey is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Failed to parameter. privkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSignPsbt(
    void* handle, void* psbt_handle, const char* privkey, bool has_grind_r) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string privkey_str(privkey);
    Privkey privkey_obj;
    if (Privkey::HasWif(privkey_str)) {
      privkey_obj = Privkey::FromWif(privkey_str);
    } else {
      privkey_obj = Privkey(privkey_str);
    }
    psbt_obj->psbt->Sign(privkey_obj, has_grind_r);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}